

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::createLiteral(StructuralParser *this,Value *v)

{
  Constant *pCVar1;
  Expression *pEVar2;
  Context local_38;
  Constant *local_20;
  Constant *lit;
  Value *v_local;
  StructuralParser *this_local;
  
  lit = (Constant *)v;
  v_local = (Value *)this;
  getContext(&local_38,this);
  pCVar1 = allocate<soul::AST::Constant,soul::AST::Context,soul::Value&>(this,&local_38,v);
  AST::Context::~Context(&local_38);
  local_20 = pCVar1;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  pEVar2 = parseSuffixes(this,&local_20->super_Expression);
  return pEVar2;
}

Assistant:

AST::Expression& createLiteral (Value v)
    {
        auto& lit = allocate<AST::Constant> (getContext(), v);
        skip();
        return parseSuffixes (lit);
    }